

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

int aec_decode_init(aec_stream_conflict *strm)

{
  int iVar1;
  internal_state_conflict *__s;
  _func_int_aec_stream_ptr_conflict **pp_Var2;
  uint32_t *puVar3;
  int local_28;
  int i;
  int modi;
  internal_state_conflict *state;
  aec_stream_conflict *strm_local;
  
  if ((strm->bits_per_sample < 0x21) && (strm->bits_per_sample != 0)) {
    __s = (internal_state_conflict *)malloc(0x358);
    if (__s == (internal_state_conflict *)0x0) {
      strm_local._4_4_ = -4;
    }
    else {
      memset(__s,0,0x358);
      create_se_table(__s->se_table);
      strm->state = __s;
      if (strm->bits_per_sample < 0x11) {
        if (strm->bits_per_sample < 9) {
          if ((strm->flags & 0x10) == 0) {
            __s->id_len = 3;
          }
          else {
            if (4 < strm->bits_per_sample) {
              return -1;
            }
            if (strm->bits_per_sample < 3) {
              __s->id_len = 1;
            }
            else {
              __s->id_len = 2;
            }
          }
          __s->bytes_per_sample = 1;
          __s->out_blklen = strm->block_size;
          __s->flush_output = flush_8;
        }
        else {
          __s->bytes_per_sample = 2;
          __s->id_len = 4;
          __s->out_blklen = strm->block_size << 1;
          if ((strm->flags & 4) == 0) {
            __s->flush_output = flush_lsb_16;
          }
          else {
            __s->flush_output = flush_msb_16;
          }
        }
      }
      else {
        __s->id_len = 5;
        if ((strm->bits_per_sample < 0x19) && ((strm->flags & 2) != 0)) {
          __s->bytes_per_sample = 3;
          if ((strm->flags & 4) == 0) {
            __s->flush_output = flush_lsb_24;
          }
          else {
            __s->flush_output = flush_msb_24;
          }
        }
        else {
          __s->bytes_per_sample = 4;
          if ((strm->flags & 4) == 0) {
            __s->flush_output = flush_lsb_32;
          }
          else {
            __s->flush_output = flush_msb_32;
          }
        }
        __s->out_blklen = strm->block_size * __s->bytes_per_sample;
      }
      if ((strm->flags & 1) == 0) {
        __s->xmin = 0;
        __s->xmax = (int)(1L << ((byte)strm->bits_per_sample & 0x3f)) - 1;
      }
      else {
        __s->xmax = (int)(1L << ((char)strm->bits_per_sample - 1U & 0x3f)) - 1;
        __s->xmin = __s->xmax ^ 0xffffffff;
      }
      __s->in_blklen = (strm->block_size * strm->bits_per_sample + __s->id_len >> 3) + 0x10;
      iVar1 = (int)(1L << ((byte)__s->id_len & 0x3f));
      pp_Var2 = (_func_int_aec_stream_ptr_conflict **)malloc((long)iVar1 << 3);
      __s->id_table = pp_Var2;
      if (__s->id_table == (_func_int_aec_stream_ptr_conflict **)0x0) {
        strm_local._4_4_ = -4;
      }
      else {
        *__s->id_table = m_low_entropy;
        for (local_28 = 1; local_28 < iVar1 + -1; local_28 = local_28 + 1) {
          __s->id_table[local_28] = m_split;
        }
        __s->id_table[iVar1 + -1] = m_uncomp;
        __s->rsi_size = (ulong)(strm->rsi * strm->block_size);
        puVar3 = (uint32_t *)malloc(__s->rsi_size << 2);
        __s->rsi_buffer = puVar3;
        if (__s->rsi_buffer == (uint32_t *)0x0) {
          strm_local._4_4_ = -4;
        }
        else {
          __s->pp = strm->flags & 8;
          if (__s->pp == 0) {
            __s->ref = 0;
            __s->encoded_block_size = strm->block_size;
          }
          else {
            __s->ref = 1;
            __s->encoded_block_size = strm->block_size - 1;
          }
          strm->total_in = 0;
          strm->total_out = 0;
          __s->rsip = __s->rsi_buffer;
          __s->flush_start = __s->rsi_buffer;
          __s->bitp = 0;
          __s->fs = 0;
          __s->mode = m_id;
          __s->offsets = (vector_t *)0x0;
          strm_local._4_4_ = 0;
        }
      }
    }
  }
  else {
    strm_local._4_4_ = -1;
  }
  return strm_local._4_4_;
}

Assistant:

int aec_decode_init(struct aec_stream *strm)
{
    struct internal_state *state;
    int modi;

    if (strm->bits_per_sample > 32 || strm->bits_per_sample == 0)
        return AEC_CONF_ERROR;

    state = malloc(sizeof(struct internal_state));
    if (state == NULL)
        return AEC_MEM_ERROR;
    memset(state, 0, sizeof(struct internal_state));

    create_se_table(state->se_table);

    strm->state = state;

    if (strm->bits_per_sample > 16) {
        state->id_len = 5;

        if (strm->bits_per_sample <= 24 && strm->flags & AEC_DATA_3BYTE) {
            state->bytes_per_sample = 3;
            if (strm->flags & AEC_DATA_MSB)
                state->flush_output = flush_msb_24;
            else
                state->flush_output = flush_lsb_24;
        } else {
            state->bytes_per_sample = 4;
            if (strm->flags & AEC_DATA_MSB)
                state->flush_output = flush_msb_32;
            else
                state->flush_output = flush_lsb_32;
        }
        state->out_blklen = strm->block_size * state->bytes_per_sample;
    }
    else if (strm->bits_per_sample > 8) {
        state->bytes_per_sample = 2;
        state->id_len = 4;
        state->out_blklen = strm->block_size * 2;
        if (strm->flags & AEC_DATA_MSB)
            state->flush_output = flush_msb_16;
        else
            state->flush_output = flush_lsb_16;
    } else {
        if (strm->flags & AEC_RESTRICTED) {
            if (strm->bits_per_sample <= 4) {
                if (strm->bits_per_sample <= 2)
                    state->id_len = 1;
                else
                    state->id_len = 2;
            } else {
                return AEC_CONF_ERROR;
            }
        } else {
            state->id_len = 3;
        }

        state->bytes_per_sample = 1;
        state->out_blklen = strm->block_size;
        state->flush_output = flush_8;
    }

    if (strm->flags & AEC_DATA_SIGNED) {
        state->xmax = (INT64_C(1) << (strm->bits_per_sample - 1)) - 1;
        state->xmin = ~state->xmax;
    } else {
        state->xmin = 0;
        state->xmax = (UINT64_C(1) << strm->bits_per_sample) - 1;
    }

    state->in_blklen = (strm->block_size * strm->bits_per_sample
                        + state->id_len) / 8 + 16;

    modi = 1UL << state->id_len;
    state->id_table = malloc(modi * sizeof(int (*)(struct aec_stream *)));
    if (state->id_table == NULL)
        return AEC_MEM_ERROR;

    state->id_table[0] = m_low_entropy;
    for (int i = 1; i < modi - 1; i++) {
        state->id_table[i] = m_split;
    }
    state->id_table[modi - 1] = m_uncomp;

    state->rsi_size = strm->rsi * strm->block_size;
    state->rsi_buffer = malloc(state->rsi_size * sizeof(uint32_t));
    if (state->rsi_buffer == NULL)
        return AEC_MEM_ERROR;

    state->pp = strm->flags & AEC_DATA_PREPROCESS;
    if (state->pp) {
        state->ref = 1;
        state->encoded_block_size = strm->block_size - 1;
    } else {
        state->ref = 0;
        state->encoded_block_size = strm->block_size;
    }
    strm->total_in = 0;
    strm->total_out = 0;

    state->rsip = state->rsi_buffer;
    state->flush_start = state->rsi_buffer;
    state->bitp = 0;
    state->fs = 0;
    state->mode = m_id;
    state->offsets = NULL;

    return AEC_OK;
}